

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

void __thiscall crnlib::symbol_codec::encode_bits(symbol_codec *this,uint bits,uint num_bits)

{
  if (num_bits == 0) {
    return;
  }
  if (0x10 < num_bits) {
    record_put_bits(this,bits >> 0x10,num_bits - 0x10);
    bits = bits & 0xffff;
    num_bits = 0x10;
  }
  record_put_bits(this,bits,num_bits);
  return;
}

Assistant:

void symbol_codec::encode_bits(uint bits, uint num_bits)
    {
        CRNLIB_ASSERT(m_mode == cEncoding);

        if (!num_bits)
        {
            return;
        }

        CRNLIB_ASSERT((num_bits == 32) || (bits <= ((1U << num_bits) - 1)));

        if (num_bits > 16)
        {
            record_put_bits(bits >> 16, num_bits - 16);
            record_put_bits(bits & 0xFFFF, 16);
        }
        else
        {
            record_put_bits(bits, num_bits);
        }
    }